

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_extension_instances
               (lyout *out,int level,lys_module *module,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
               lys_ext_instance **ext,uint count)

{
  uint8_t *puVar1;
  ushort uVar2;
  lys_ext *plVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  LY_STMT LVar9;
  int iVar10;
  lys_module *plVar11;
  lys_module *plVar12;
  ulong uVar13;
  undefined8 *puVar14;
  lys_ext_instance *plVar15;
  long *plVar16;
  uint *puVar17;
  uint8_t substmt_index_00;
  char **ppcVar18;
  lys_iffeature *iffeature;
  lys_tpdf *tpdf;
  lys_revision *rev;
  lys_ext_instance_complex *plVar19;
  lys_type *type;
  lys_unique *uniq;
  lys_restr *plVar20;
  lys_when *when;
  LYEXT_SUBSTMT LVar21;
  lyout *plVar22;
  ulong uVar23;
  undefined4 in_register_00000034;
  lys_ext_instance **pplVar24;
  undefined7 in_register_00000081;
  char *pcVar25;
  char *pcVar26;
  ulong uVar27;
  long lVar28;
  lys_node *node;
  lys_unique *uniq_00;
  lys_iffeature *iffeature_00;
  lys_tpdf *tpdf_00;
  lys_revision *rev_00;
  lys_type *type_00;
  lys_restr *plVar29;
  lys_when *when_00;
  uint uVar30;
  uint16_t val1;
  uint16_t val2;
  int *content_00;
  lyext_substmt *local_c0;
  long local_b8;
  ulong local_b0;
  char **local_a8;
  char *local_a0;
  undefined8 local_98;
  ulong local_90;
  uint local_84;
  lys_ext *local_80;
  long *local_78;
  uint local_70;
  LYEXT_SUBSTMT local_6c;
  long *local_68;
  uint local_60;
  int local_5c;
  ulong local_58;
  lys_module *local_50;
  lys_ext_instance **local_48;
  lyout *local_40;
  int local_38;
  int local_34 [2];
  int content;
  
  local_98 = CONCAT44(in_register_00000034,level);
  if (count == 0) {
    return;
  }
  uVar27 = CONCAT71(in_register_00000081,substmt_index) & 0xffffffff;
  local_a8 = &module->prefix;
  local_84 = level * 2;
  local_70 = level * 2 + 2;
  local_38 = level + 1;
  local_5c = level + 2;
  uVar13 = (ulong)count;
  uVar23 = 0;
  pcVar25 = (char *)0x0;
  local_60 = (uint)CONCAT71(in_register_00000081,substmt_index);
  local_90 = uVar13;
  local_6c = substmt;
  local_50 = module;
  local_48 = ext;
  local_40 = out;
LAB_0018a520:
  plVar15 = local_48[uVar23];
  if ((((plVar15->flags & 1) == 0) && ((uint)plVar15->insubstmt == substmt)) &&
     (plVar15->insubstmt_index == (uint8_t)uVar27)) {
    plVar11 = plVar15->def->module;
    if (plVar11 == *(module->ctx->models).list) {
      pcVar26 = plVar15->arg_value;
      iVar8 = strcmp(pcVar26,"operation");
      if (((iVar8 == 0) || (iVar8 = strcmp(pcVar26,"select"), iVar8 == 0)) ||
         (iVar8 = strcmp(pcVar26,"type"), substmt = local_6c, iVar8 == 0)) {
        uVar27 = (ulong)local_60;
        uVar13 = local_90;
        module = local_50;
        substmt = local_6c;
        goto LAB_0018c30d;
      }
    }
    plVar11 = lys_main_module(plVar11);
    content_00 = (int *)0x18a577;
    plVar12 = lys_main_module(local_50);
    plVar22 = local_40;
    ppcVar18 = local_a8;
    if (plVar11 == plVar12) {
LAB_0018a5ac:
      pcVar25 = *ppcVar18;
    }
    else {
      uVar13 = (ulong)local_50->imp_size;
      if (uVar13 != 0) {
        ppcVar18 = &local_50->imp->prefix;
        do {
          if (plVar11 == ((lys_import *)(ppcVar18 + -1))->module) goto LAB_0018a5ac;
          ppcVar18 = ppcVar18 + 7;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
    uVar27 = (ulong)local_60;
    if (pcVar25 == (char *)0x0) {
      __assert_fail("prefix",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                    ,0x7c5,
                    "void yin_print_extension_instances(struct lyout *, int, const struct lys_module *, LYEXT_SUBSTMT, uint8_t, struct lys_ext_instance **, unsigned int)"
                   );
    }
    local_34[0] = 0;
    plVar3 = local_48[uVar23]->def;
    pcVar26 = local_48[uVar23]->arg_value;
    local_58 = uVar23;
    if (pcVar26 == (char *)0x0) {
      content_00 = (int *)0x18a67b;
      ly_print(local_40,"%*s<%s:%s",(ulong)local_84,"",pcVar25,plVar3->name);
    }
    else if ((plVar3->flags & 1) == 0) {
      yin_print_open(local_40,(int)local_98,pcVar25,plVar3->name,plVar3->argument,pcVar26,0);
    }
    else {
      local_34[0] = 1;
      ly_print(local_40,"%*s<%s:%s",(ulong)local_84,"",pcVar25,plVar3->name);
      ly_print(plVar22,">\n");
      pplVar24 = local_48;
      uVar27 = (ulong)local_60;
      ly_print(plVar22,"%*s<%s:%s>",(ulong)local_70,"",pcVar25,local_48[local_58]->def->argument);
      lyxml_dump_text(plVar22,pplVar24[local_58]->arg_value,LYXML_DATA_ELEM);
      uVar23 = local_58;
      content_00 = (int *)0x18a755;
      ly_print(plVar22,"</%s:%s>\n",pcVar25,pplVar24[local_58]->def->argument);
    }
    plVar15 = local_48[uVar23];
    bVar7 = plVar15->ext_size;
    if (bVar7 != 0) {
      if (local_34[0] == 0) {
        local_34[0] = 1;
        content_00 = (int *)0x18a783;
        ly_print(local_40,">\n");
        plVar15 = local_48[uVar23];
        bVar7 = plVar15->ext_size;
      }
      yin_print_extension_instances
                (local_40,local_38,local_50,LYEXT_SUBSTMT_SELF,'\0',plVar15->ext,(uint)bVar7);
      plVar15 = local_48[uVar23];
    }
    if ((plVar15->ext_type == '\x01') && (local_80 = plVar15[1].def, local_80 != (lys_ext *)0x0)) {
      local_b8 = 0;
      local_a0 = pcVar25;
      do {
        plVar22 = local_40;
        plVar11 = local_50;
        LVar21 = *(LYEXT_SUBSTMT *)(local_80->padding + local_b8 * 0x18 + -0x1b);
        if (0x37 < (uint)LVar21) goto switchD_0018a812_caseD_13;
        puVar1 = local_80->padding + local_b8 * 0x18 + -0x1b;
        switch(LVar21) {
        case LYEXT_SUBSTMT_SELF:
          goto switchD_0018a812_caseD_0;
        case LYEXT_SUBSTMT_ARGUMENT:
          content_00 = (int *)0x18ae93;
          local_68 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_ARGUMENT,
                                        (lys_ext_instance_complex *)local_48[uVar23],
                                        (lyext_substmt **)0x0);
          plVar22 = local_40;
          if ((local_68 != (long *)0x0) && (*local_68 != 0)) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              content_00 = (int *)0x18aed0;
              ly_print(local_40,">\n");
            }
            if (*(uint *)&local_80->ref < 2) {
              iVar10 = 0;
              yin_print_open(plVar22,local_38,(char *)0x0,"argument","name",(char *)*local_68,0);
              uVar23 = local_58;
              iVar8 = lys_ext_iter(local_48[local_58]->ext,local_48[local_58]->ext_size,'\0',
                                   LYEXT_SUBSTMT_ARGUMENT);
              plVar11 = local_50;
              if (iVar8 != -1) {
                iVar10 = 0;
                do {
                  if (iVar10 == 0) {
                    ly_print(local_40,">\n");
                    iVar10 = 1;
                  }
                  pplVar24 = local_48;
                  yin_print_extension_instances
                            (local_40,local_5c,plVar11,LYEXT_SUBSTMT_ARGUMENT,'\0',
                             local_48[uVar23]->ext + iVar8,1);
                  iVar8 = lys_ext_iter(pplVar24[uVar23]->ext,pplVar24[uVar23]->ext_size,
                                       (char)iVar8 + '\x01',LYEXT_SUBSTMT_ARGUMENT);
                } while (iVar8 != -1);
              }
              if (((char)local_68[1] == '\x01') ||
                 (iVar8 = lys_ext_iter(local_48[uVar23]->ext,local_48[uVar23]->ext_size,'\0',
                                       LYEXT_SUBSTMT_YINELEM), plVar22 = local_40, iVar8 != -1)) {
                plVar22 = local_40;
                if (iVar10 == 0) {
                  ly_print(local_40,">\n");
                  iVar10 = 1;
                }
                pcVar25 = "false";
                if ((char)local_68[1] == '\x01') {
                  pcVar25 = "true";
                }
                yin_print_substmt(plVar22,local_5c,LYEXT_SUBSTMT_YINELEM,'\0',pcVar25,plVar11,
                                  local_48[local_58]->ext,(uint)local_48[local_58]->ext_size);
              }
              content_00 = (int *)0x18bcf8;
              yin_print_close(plVar22,local_38,(char *)0x0,"argument",iVar10);
              uVar23 = local_58;
            }
            else {
              pcVar25 = *(char **)*local_68;
              uVar23 = local_58;
              if (pcVar25 != (char *)0x0) {
                uVar13 = 0;
LAB_0018aef8:
                uVar23 = local_58;
                yin_print_open(local_40,local_38,(char *)0x0,"argument","name",pcVar25,0);
                iVar8 = -1;
                iVar10 = 0;
                do {
                  plVar15 = local_48[uVar23];
                  pplVar24 = plVar15->ext;
                  do {
                    iVar8 = lys_ext_iter(pplVar24,plVar15->ext_size,(char)iVar8 + '\x01',
                                         LYEXT_SUBSTMT_ARGUMENT);
                    plVar22 = local_40;
                    if (iVar8 == -1) {
                      if (*(char *)(local_68[1] + uVar13) != '\x01') {
                        plVar15 = local_48[uVar23];
                        pplVar24 = plVar15->ext;
                        iVar8 = -1;
                        goto LAB_0018affb;
                      }
                      if (iVar10 == 0) {
                        ly_print(local_40,">\n");
                        pcVar25 = "false";
                        if (*(char *)(local_68[1] + uVar13) == '\x01') {
                          pcVar25 = "true";
                        }
                        iVar10 = 1;
                      }
                      else {
                        pcVar25 = "true";
                      }
                      uVar30 = (uint)local_48[local_58]->ext_size;
                      pplVar24 = local_48[local_58]->ext;
                      goto LAB_0018b110;
                    }
                    plVar15 = local_48[uVar23];
                    pplVar24 = plVar15->ext;
                  } while (uVar13 != pplVar24[iVar8]->insubstmt_index);
                  if (iVar10 == 0) {
                    ly_print(local_40,">\n");
                    pplVar24 = local_48[uVar23]->ext;
                    iVar10 = 1;
                  }
                  yin_print_extension_instances
                            (local_40,local_5c,local_50,LYEXT_SUBSTMT_ARGUMENT,(uint8_t)uVar13,
                             pplVar24 + iVar8,1);
                } while( true );
              }
            }
          }
          break;
        default:
          plVar19 = (lys_ext_instance_complex *)local_48[uVar23];
          content_00 = (int *)0x18a82e;
          plVar16 = (long *)lys_ext_complex_get_substmt(LVar21,plVar19,&local_c0);
          if ((plVar16 != (long *)0x0) &&
             (pcVar25 = (char *)*plVar16, (long *)pcVar25 != (long *)0x0)) {
            if (local_c0->cardinality < LY_STMT_CARD_SOME) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                pcVar25 = (char *)*plVar16;
              }
              bVar7 = plVar19->ext_size;
              pplVar24 = plVar19->ext;
              plVar22 = local_40;
              plVar11 = local_50;
              goto LAB_0018a979;
            }
            pcVar26 = *(char **)pcVar25;
            if (pcVar26 != (char *)0x0) {
              lVar28 = 0;
              do {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                  pcVar26 = *(char **)((long)pcVar25 + lVar28 * 8);
                }
                content_00 = (int *)(ulong)plVar19->ext_size;
                yin_print_substmt(local_40,local_38,LVar21,(uint8_t)lVar28,pcVar26,local_50,
                                  plVar19->ext,(uint)plVar19->ext_size);
                pcVar26 = *(char **)((long)pcVar25 + (lVar28 + 1) * 8);
                lVar28 = lVar28 + 1;
              } while (pcVar26 != (char *)0x0);
            }
          }
          break;
        case LYEXT_SUBSTMT_BELONGSTO:
          content_00 = (int *)0x18b514;
          local_78 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_BELONGSTO,
                                        (lys_ext_instance_complex *)local_48[uVar23],
                                        (lyext_substmt **)0x0);
          plVar22 = local_40;
          if ((local_78 != (long *)0x0) && (plVar16 = (long *)*local_78, plVar16 != (long *)0x0)) {
            if (*(uint *)&local_80->ref < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                plVar16 = (long *)*local_78;
              }
              yin_print_open(plVar22,local_38,(char *)0x0,"belongs-to","module",(char *)plVar16,1);
              uVar23 = local_58;
              iVar8 = lys_ext_iter(local_48[local_58]->ext,local_48[local_58]->ext_size,'\0',
                                   LYEXT_SUBSTMT_BELONGSTO);
              iVar10 = local_5c;
              pplVar24 = local_48;
              while (local_48 = pplVar24, iVar8 != -1) {
                yin_print_extension_instances
                          (plVar22,iVar10,local_50,LYEXT_SUBSTMT_BELONGSTO,'\0',
                           pplVar24[uVar23]->ext + iVar8,1);
                iVar8 = lys_ext_iter(pplVar24[uVar23]->ext,pplVar24[uVar23]->ext_size,
                                     (char)iVar8 + '\x01',LYEXT_SUBSTMT_BELONGSTO);
                pplVar24 = local_48;
              }
              yin_print_substmt(plVar22,iVar10,LYEXT_SUBSTMT_PREFIX,'\0',(char *)local_78[1],
                                local_50,pplVar24[uVar23]->ext,(uint)pplVar24[uVar23]->ext_size);
              content_00 = (int *)0x18bed7;
              ly_print(plVar22,"%*s</%s>\n",(ulong)local_70,"");
            }
            else if (*plVar16 != 0) {
              uVar13 = 0;
              do {
                plVar22 = local_40;
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                  plVar16 = (long *)*local_78;
                }
                yin_print_open(plVar22,local_38,(char *)0x0,"belongs-to","module",
                               (char *)plVar16[uVar13],1);
                uVar23 = local_58;
                iVar10 = lys_ext_iter(local_48[local_58]->ext,local_48[local_58]->ext_size,'\0',
                                      LYEXT_SUBSTMT_BELONGSTO);
                plVar11 = local_50;
                iVar8 = local_5c;
                uVar27 = uVar13 & 0xff;
                local_b0 = uVar13;
                if (iVar10 != -1) {
                  local_68 = (long *)CONCAT44(local_68._4_4_,(int)uVar27);
                  do {
                    yin_print_extension_instances
                              (plVar22,iVar8,plVar11,LYEXT_SUBSTMT_BELONGSTO,(uint8_t)uVar27,
                               local_48[uVar23]->ext + iVar10,1);
                    iVar10 = lys_ext_iter(local_48[uVar23]->ext,local_48[uVar23]->ext_size,
                                          (char)iVar10 + '\x01',LYEXT_SUBSTMT_BELONGSTO);
                    uVar27 = (ulong)local_68 & 0xffffffff;
                  } while (iVar10 != -1);
                }
                plVar16 = local_78;
                uVar6 = local_b0;
                yin_print_substmt(plVar22,iVar8,LYEXT_SUBSTMT_PREFIX,(uint8_t)uVar27,
                                  *(char **)(local_78[1] + local_b0 * 8),plVar11,
                                  local_48[uVar23]->ext,(uint)local_48[uVar23]->ext_size);
                content_00 = (int *)0x18b6a6;
                ly_print(plVar22,"%*s</%s>\n",(ulong)local_70,"");
                plVar16 = (long *)*plVar16;
                uVar13 = uVar6 + 1;
              } while (plVar16[uVar6 + 1] != 0);
            }
          }
          break;
        case LYEXT_SUBSTMT_VALUE:
          plVar15 = local_48[uVar23];
          uVar4 = *(undefined8 *)(puVar1 + 8);
          puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
          if (puVar17 != (uint *)0x0) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                content_00 = (int *)0x18c162;
                ly_print(local_40,">\n");
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                plVar15 = local_48[local_58];
                substmt_index_00 = (uint8_t)local_50;
              }
              else {
                substmt_index_00 = (uint8_t)local_50;
              }
              yin_print_signed(plVar22,local_38,LYEXT_SUBSTMT_SELF,substmt_index_00,
                               (lys_module *)plVar15->ext,
                               (lys_ext_instance **)(ulong)plVar15->ext_size,*puVar17,
                               (int)content_00);
              uVar23 = local_58;
            }
            else if (*(long *)puVar17 != 0) {
              lVar28 = 0;
              do {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  content_00 = (int *)0x18ad05;
                  ly_print(local_40,">\n");
                  puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                }
                yin_print_signed(local_40,local_38,(LYEXT_SUBSTMT)lVar28 & 0xff,(uint8_t)local_50,
                                 (lys_module *)local_48[uVar23]->ext,
                                 (lys_ext_instance **)(ulong)local_48[uVar23]->ext_size,
                                 **(uint **)(puVar17 + lVar28 * 2),(int)content_00);
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                lVar5 = lVar28 * 2;
                lVar28 = lVar28 + 1;
              } while (*(long *)(puVar17 + lVar5 + 2) != 0);
            }
          }
          break;
        case LYEXT_SUBSTMT_VERSION:
        case LYEXT_SUBSTMT_YINELEM:
          break;
        case LYEXT_SUBSTMT_MODIFIER:
          plVar19 = (lys_ext_instance_complex *)local_48[uVar23];
          pcVar25 = "invert-match";
          LVar9 = LY_STMT_MODIFIER;
          pcVar26 = (char *)0x0;
          goto LAB_0018b23f;
        case LYEXT_SUBSTMT_REQINSTANCE:
          plVar19 = (lys_ext_instance_complex *)local_48[uVar23];
          pcVar25 = "true";
          LVar9 = LY_STMT_REQINSTANCE;
          pcVar26 = "false";
LAB_0018b23f:
          content_00 = local_34;
          yin_print_extcomplex_bool
                    (local_40,local_38,local_50,plVar19,LVar9,pcVar25,pcVar26,content_00);
          break;
        case LYEXT_SUBSTMT_CONFIG:
          plVar19 = (lys_ext_instance_complex *)local_48[uVar23];
          pcVar26 = "false";
          pcVar25 = "true";
          LVar9 = LY_STMT_CONFIG;
          val2 = 6;
          val1 = 5;
          goto LAB_0018b3b8;
        case LYEXT_SUBSTMT_MANDATORY:
          plVar19 = (lys_ext_instance_complex *)local_48[uVar23];
          pcVar26 = "true";
          pcVar25 = "false";
          LVar9 = LY_STMT_MANDATORY;
          val2 = 0x40;
          val1 = 0x80;
          goto LAB_0018b3b8;
        case LYEXT_SUBSTMT_ORDEREDBY:
          plVar19 = (lys_ext_instance_complex *)local_48[uVar23];
          pcVar26 = "user";
          pcVar25 = "system";
          LVar9 = LY_STMT_ORDEREDBY;
          val2 = 0x100;
          val1 = 0;
LAB_0018b3b8:
          content_00 = local_34;
          yin_print_extcomplex_flags
                    (local_40,local_38,local_50,plVar19,LVar9,pcVar25,pcVar26,val1,val2,content_00);
          break;
        case LYEXT_SUBSTMT_STATUS:
          uVar2 = *(ushort *)((long)&local_48[uVar23][1].parent + *(undefined8 *)(puVar1 + 8));
          if (uVar2 != 0) {
            if ((uVar2 & 8) == 0) {
              if ((uVar2 & 0x10) == 0) {
                if ((uVar2 & 0x20) == 0) break;
                if (local_34[0] == 0) {
                  pcVar25 = "obsolete";
                  goto LAB_0018c288;
                }
                pcVar25 = "obsolete";
              }
              else {
                if (local_34[0] == 0) {
                  pcVar25 = "deprecated";
                  goto LAB_0018c288;
                }
                pcVar25 = "deprecated";
              }
            }
            else if (local_34[0] == 0) {
              pcVar25 = "current";
LAB_0018c288:
              local_34[0] = 1;
              ly_print(local_40,">\n");
            }
            else {
              pcVar25 = "current";
            }
            bVar7 = local_48[local_58]->ext_size;
            LVar21 = LYEXT_SUBSTMT_STATUS;
            pplVar24 = local_48[local_58]->ext;
            uVar23 = local_58;
LAB_0018a979:
            content_00 = (int *)(ulong)bVar7;
            yin_print_substmt(plVar22,local_38,LVar21,'\0',pcVar25,plVar11,pplVar24,(uint)bVar7);
          }
          break;
        case LYEXT_SUBSTMT_DIGITS:
          plVar15 = local_48[uVar23];
          uVar4 = *(undefined8 *)(puVar1 + 8);
          if (*(uint *)&local_80->ref < 2) {
            pcVar25 = (char *)(ulong)*(byte *)((long)&plVar15[1].parent + uVar4);
          }
          else {
            pcVar25 = *(char **)((long)&plVar15[1].parent + uVar4);
            if (pcVar25 != (char *)0x0) {
              if (*pcVar25 != '\0') {
                lVar28 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                    pcVar25 = *(char **)((long)&plVar15[1].parent + uVar4);
                  }
                  content_00 = (int *)(ulong)(byte)pcVar25[lVar28];
                  yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_DIGITS,(uint8_t)lVar28,local_50
                                     ,local_48[uVar23]->ext,(uint)local_48[uVar23]->ext_size,
                                     (uint)(byte)pcVar25[lVar28]);
                  pcVar25 = *(char **)((long)&plVar15[1].parent + uVar4);
                  lVar5 = lVar28 + 1;
                  lVar28 = lVar28 + 1;
                } while (pcVar25[lVar5] != '\0');
              }
              break;
            }
          }
          bVar7 = (byte)pcVar25;
          if (bVar7 != 0) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40,">\n");
              bVar7 = *(byte *)((long)&plVar15[1].parent + uVar4);
              plVar15 = local_48[local_58];
            }
            pplVar24 = plVar15->ext;
            uVar30 = (uint)plVar15->ext_size;
            content_00 = (int *)(ulong)bVar7;
            LVar21 = LYEXT_SUBSTMT_DIGITS;
LAB_0018c23c:
            yin_print_unsigned(plVar22,local_38,LVar21,'\0',local_50,pplVar24,uVar30,
                               (uint)content_00);
            uVar23 = local_58;
          }
          break;
        case LYEXT_SUBSTMT_MAX:
          plVar15 = local_48[uVar23];
          uVar4 = *(undefined8 *)(puVar1 + 8);
          puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
          if (puVar17 != (uint *)0x0) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                plVar15 = local_48[local_58];
              }
              pplVar24 = plVar15->ext;
              uVar30 = (uint)plVar15->ext_size;
              content_00 = (int *)(ulong)*puVar17;
              LVar21 = LYEXT_SUBSTMT_MAX;
              goto LAB_0018c23c;
            }
            if (*(long *)puVar17 != 0) {
              lVar28 = 0;
              do {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                  puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                }
                content_00 = (int *)(ulong)**(uint **)(puVar17 + lVar28 * 2);
                yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_MAX,(uint8_t)lVar28,local_50,
                                   local_48[uVar23]->ext,(uint)local_48[uVar23]->ext_size,
                                   **(uint **)(puVar17 + lVar28 * 2));
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                lVar5 = lVar28 * 2;
                lVar28 = lVar28 + 1;
              } while (*(long *)(puVar17 + lVar5 + 2) != 0);
            }
          }
          break;
        case LYEXT_SUBSTMT_MIN:
          plVar15 = local_48[uVar23];
          uVar4 = *(undefined8 *)(puVar1 + 8);
          puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
          if (puVar17 != (uint *)0x0) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                plVar15 = local_48[local_58];
              }
              pplVar24 = plVar15->ext;
              uVar30 = (uint)plVar15->ext_size;
              content_00 = (int *)(ulong)*puVar17;
              LVar21 = LYEXT_SUBSTMT_MIN;
              goto LAB_0018c23c;
            }
            if (*(long *)puVar17 != 0) {
              lVar28 = 0;
              do {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                  puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                }
                content_00 = (int *)(ulong)**(uint **)(puVar17 + lVar28 * 2);
                yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_MIN,(uint8_t)lVar28,local_50,
                                   local_48[uVar23]->ext,(uint)local_48[uVar23]->ext_size,
                                   **(uint **)(puVar17 + lVar28 * 2));
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                lVar5 = lVar28 * 2;
                lVar28 = lVar28 + 1;
              } while (*(long *)(puVar17 + lVar5 + 2) != 0);
            }
          }
          break;
        case LYEXT_SUBSTMT_POSITION:
          plVar15 = local_48[uVar23];
          uVar4 = *(undefined8 *)(puVar1 + 8);
          puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
          if (puVar17 != (uint *)0x0) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                plVar15 = local_48[local_58];
              }
              pplVar24 = plVar15->ext;
              uVar30 = (uint)plVar15->ext_size;
              content_00 = (int *)(ulong)*puVar17;
              LVar21 = LYEXT_SUBSTMT_POSITION;
              goto LAB_0018c23c;
            }
            if (*(long *)puVar17 != 0) {
              lVar28 = 0;
              do {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                  puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                }
                content_00 = (int *)(ulong)**(uint **)(puVar17 + lVar28 * 2);
                yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_POSITION,(uint8_t)lVar28,local_50
                                   ,local_48[uVar23]->ext,(uint)local_48[uVar23]->ext_size,
                                   **(uint **)(puVar17 + lVar28 * 2));
                puVar17 = *(uint **)((long)&plVar15[1].parent + uVar4);
                lVar5 = lVar28 * 2;
                lVar28 = lVar28 + 1;
              } while (*(long *)(puVar17 + lVar5 + 2) != 0);
            }
          }
          break;
        case LYEXT_SUBSTMT_UNIQUE:
          content_00 = (int *)0x18b6d3;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_UNIQUE,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (uniq_00 = (lys_unique *)*plVar16, uniq_00 != (lys_unique *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                uniq_00 = (lys_unique *)*plVar16;
              }
              plVar11 = local_50;
              yin_print_unique(local_40,local_38,local_50,uniq_00);
              iVar10 = 0;
              iVar8 = lys_ext_iter(local_48[uVar23]->ext,local_48[uVar23]->ext_size,'\0',
                                   LYEXT_SUBSTMT_UNIQUE);
              if (iVar8 != -1) {
                iVar10 = 0;
                do {
                  if (iVar10 == 0) {
                    ly_print(local_40,">\n");
                    iVar10 = 1;
                  }
                  pplVar24 = local_48;
                  yin_print_extension_instances
                            (local_40,local_5c,plVar11,LYEXT_SUBSTMT_UNIQUE,'\0',
                             local_48[uVar23]->ext + iVar8,1);
                  iVar8 = lys_ext_iter(pplVar24[uVar23]->ext,pplVar24[uVar23]->ext_size,
                                       (char)iVar8 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                } while (iVar8 != -1);
              }
              content_00 = (int *)0x18bfd9;
              yin_print_close(local_40,local_38,(char *)0x0,"unique",iVar10);
            }
            else {
              uniq = (lys_unique *)uniq_00->expr;
              if (uniq != (lys_unique *)0x0) {
                uVar30 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                    uniq = (lys_unique *)uniq_00->expr;
                  }
                  yin_print_unique(local_40,local_38,local_50,uniq);
                  plVar15 = local_48[uVar23];
                  pplVar24 = plVar15->ext;
                  iVar8 = -1;
                  while (iVar8 = lys_ext_iter(pplVar24,plVar15->ext_size,(char)iVar8 + '\x01',
                                              LYEXT_SUBSTMT_UNIQUE), iVar8 != -1) {
                    plVar15 = local_48[uVar23];
                    pplVar24 = plVar15->ext;
                    if (uVar30 == pplVar24[iVar8]->insubstmt_index) {
                      ly_print(local_40,">\n");
                      pplVar24 = local_48[uVar23]->ext;
                      do {
                        yin_print_extension_instances
                                  (local_40,local_5c,local_50,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar30,
                                   pplVar24 + iVar8,1);
                        plVar15 = local_48[uVar23];
                        pplVar24 = plVar15->ext;
                        do {
                          iVar8 = lys_ext_iter(pplVar24,plVar15->ext_size,(char)iVar8 + '\x01',
                                               LYEXT_SUBSTMT_UNIQUE);
                          if (iVar8 == -1) {
                            iVar8 = 1;
                            goto LAB_0018b821;
                          }
                          plVar15 = local_48[uVar23];
                          pplVar24 = plVar15->ext;
                        } while (uVar30 != pplVar24[iVar8]->insubstmt_index);
                      } while( true );
                    }
                  }
                  iVar8 = 0;
LAB_0018b821:
                  content_00 = (int *)0x18b836;
                  yin_print_close(local_40,local_38,(char *)0x0,"unique",iVar8);
                  uVar30 = uVar30 + 1;
                  uniq = *(lys_unique **)&uniq_00->expr_size;
                  uniq_00 = (lys_unique *)&uniq_00->expr_size;
                } while (uniq != (lys_unique *)0x0);
              }
            }
          }
          break;
        case 0x20:
          content_00 = (int *)0x18b8fc;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_MODULE,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (plVar11 = (lys_module *)*plVar16, plVar11 != (lys_module *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                plVar11 = (lys_module *)*plVar16;
              }
              content_00 = (int *)0x18c050;
              yin_print_model_(local_40,local_38,plVar11);
            }
            else {
              plVar12 = (lys_module *)plVar11->ctx;
              plVar22 = local_40;
              while (local_40 = plVar22, plVar12 != (lys_module *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  plVar12 = (lys_module *)plVar11->ctx;
                }
                content_00 = (int *)0x18b961;
                yin_print_model_(plVar22,local_38,plVar12);
                plVar12 = (lys_module *)plVar11->name;
                plVar11 = (lys_module *)&plVar11->name;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x21:
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x2e:
          content_00 = (int *)0x18a8d4;
          puVar14 = (undefined8 *)
                    lys_ext_complex_get_substmt
                              (LVar21,(lys_ext_instance_complex *)local_48[uVar23],
                               (lyext_substmt **)0x0);
          if (puVar14 != (undefined8 *)0x0) {
            for (node = (lys_node *)*puVar14; node != (lys_node *)0x0; node = node->next) {
              content_00 = (int *)0x18a8f2;
              LVar9 = lys_snode2stmt(node->nodetype);
              plVar22 = local_40;
              if (LVar9 == *(LY_STMT *)puVar1) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                }
                content_00 = (int *)0x18a92d;
                yin_print_snode(plVar22,local_38,node,0xffff);
                uVar23 = local_58;
              }
            }
          }
          break;
        case 0x2f:
          content_00 = (int *)0x18aac2;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_TYPEDEF,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (tpdf_00 = (lys_tpdf *)*plVar16, tpdf_00 != (lys_tpdf *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                tpdf_00 = (lys_tpdf *)*plVar16;
              }
              content_00 = (int *)0x18bb3f;
              yin_print_typedef(local_40,local_38,local_50,tpdf_00);
            }
            else {
              tpdf = (lys_tpdf *)tpdf_00->name;
              plVar22 = local_40;
              while (local_40 = plVar22, tpdf != (lys_tpdf *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  tpdf = (lys_tpdf *)tpdf_00->name;
                }
                content_00 = (int *)0x18ab2b;
                yin_print_typedef(plVar22,local_38,local_50,tpdf);
                tpdf = (lys_tpdf *)tpdf_00->dsc;
                tpdf_00 = (lys_tpdf *)&tpdf_00->dsc;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x30:
          content_00 = (int *)0x18b3dc;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_TYPE,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (type_00 = (lys_type *)*plVar16, type_00 != (lys_type *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                type_00 = (lys_type *)*plVar16;
              }
              content_00 = (int *)0x18bda6;
              yin_print_type(local_40,local_38,local_50,type_00);
            }
            else {
              type = *(lys_type **)type_00;
              plVar22 = local_40;
              while (local_40 = plVar22, type != (lys_type *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  type = *(lys_type **)type_00;
                }
                content_00 = (int *)0x18b445;
                yin_print_type(plVar22,local_38,local_50,type);
                type = (lys_type *)type_00->ext;
                type_00 = (lys_type *)&type_00->ext;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x31:
          content_00 = (int *)0x18a997;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_IFFEATURE,
                                       (lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (iffeature_00 = (lys_iffeature *)*plVar16, iffeature_00 != (lys_iffeature *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                iffeature_00 = (lys_iffeature *)*plVar16;
              }
              content_00 = (int *)0x18bad7;
              yin_print_iffeature(local_40,local_38,local_50,iffeature_00);
            }
            else {
              iffeature = (lys_iffeature *)iffeature_00->expr;
              plVar22 = local_40;
              while (local_40 = plVar22, iffeature != (lys_iffeature *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  iffeature = (lys_iffeature *)iffeature_00->expr;
                }
                content_00 = (int *)0x18aa00;
                yin_print_iffeature(plVar22,local_38,local_50,iffeature);
                iffeature = *(lys_iffeature **)&iffeature_00->ext_size;
                iffeature_00 = (lys_iffeature *)&iffeature_00->ext_size;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x32:
          content_00 = (int *)0x18aa29;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_LENGTH,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (plVar29 = (lys_restr *)*plVar16, plVar29 != (lys_restr *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                plVar29 = (lys_restr *)*plVar16;
              }
              pcVar25 = "length";
LAB_0018c007:
              content_00 = (int *)0x18c01a;
              yin_print_typerestr(local_40,local_38,local_50,plVar29,pcVar25);
            }
            else {
              plVar20 = (lys_restr *)plVar29->expr;
              plVar22 = local_40;
              while (local_40 = plVar22, plVar20 != (lys_restr *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  plVar20 = (lys_restr *)plVar29->expr;
                }
                content_00 = (int *)0x18aa99;
                yin_print_typerestr(plVar22,local_38,local_50,plVar20,"length");
                plVar20 = (lys_restr *)plVar29->dsc;
                plVar29 = (lys_restr *)&plVar29->dsc;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x33:
          content_00 = (int *)0x18b165;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_MUST,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (plVar29 = (lys_restr *)*plVar16, plVar29 != (lys_restr *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                plVar29 = (lys_restr *)*plVar16;
              }
              content_00 = (int *)0x18bd32;
              yin_print_must(local_40,local_38,local_50,plVar29);
            }
            else {
              plVar20 = (lys_restr *)plVar29->expr;
              plVar22 = local_40;
              while (local_40 = plVar22, plVar20 != (lys_restr *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  plVar20 = (lys_restr *)plVar29->expr;
                }
                content_00 = (int *)0x18b1ce;
                yin_print_must(plVar22,local_38,local_50,plVar20);
                plVar20 = (lys_restr *)plVar29->dsc;
                plVar29 = (lys_restr *)&plVar29->dsc;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x34:
          content_00 = (int *)0x18b863;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_PATTERN,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (plVar29 = (lys_restr *)*plVar16, plVar29 != (lys_restr *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                plVar29 = (lys_restr *)*plVar16;
              }
              pcVar25 = "pattern";
              goto LAB_0018c007;
            }
            plVar20 = (lys_restr *)plVar29->expr;
            plVar22 = local_40;
            while (local_40 = plVar22, plVar20 != (lys_restr *)0x0) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar22,">\n");
                plVar20 = (lys_restr *)plVar29->expr;
              }
              content_00 = (int *)0x18b8d3;
              yin_print_typerestr(plVar22,local_38,local_50,plVar20,"pattern");
              plVar20 = (lys_restr *)plVar29->dsc;
              plVar29 = (lys_restr *)&plVar29->dsc;
              uVar23 = local_58;
              plVar22 = local_40;
            }
          }
          break;
        case 0x35:
          content_00 = (int *)0x18ab54;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_RANGE,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (plVar29 = (lys_restr *)*plVar16, plVar29 != (lys_restr *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                plVar29 = (lys_restr *)*plVar16;
              }
              pcVar25 = "range";
              goto LAB_0018c007;
            }
            plVar20 = (lys_restr *)plVar29->expr;
            plVar22 = local_40;
            while (local_40 = plVar22, plVar20 != (lys_restr *)0x0) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar22,">\n");
                plVar20 = (lys_restr *)plVar29->expr;
              }
              content_00 = (int *)0x18abc4;
              yin_print_typerestr(plVar22,local_38,local_50,plVar20,"range");
              plVar20 = (lys_restr *)plVar29->dsc;
              plVar29 = (lys_restr *)&plVar29->dsc;
              uVar23 = local_58;
              plVar22 = local_40;
            }
          }
          break;
        case 0x36:
          content_00 = (int *)0x18b98a;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_WHEN,(lys_ext_instance_complex *)local_48[uVar23],
                                       (lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (when_00 = (lys_when *)*plVar16, when_00 != (lys_when *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                when_00 = (lys_when *)*plVar16;
              }
              content_00 = (int *)0x18c08a;
              yin_print_when(local_40,local_38,local_50,when_00);
            }
            else {
              when = (lys_when *)when_00->cond;
              plVar22 = local_40;
              while (local_40 = plVar22, when != (lys_when *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  when = (lys_when *)when_00->cond;
                }
                content_00 = (int *)0x18b9f3;
                yin_print_when(plVar22,local_38,local_50,when);
                when = (lys_when *)when_00->dsc;
                when_00 = (lys_when *)&when_00->dsc;
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
          break;
        case 0x37:
          content_00 = (int *)0x18b307;
          plVar16 = (long *)lys_ext_complex_get_substmt
                                      (LY_STMT_REVISION,(lys_ext_instance_complex *)local_48[uVar23]
                                       ,(lyext_substmt **)0x0);
          if ((plVar16 != (long *)0x0) &&
             (rev_00 = (lys_revision *)*plVar16, rev_00 != (lys_revision *)0x0)) {
            if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40,">\n");
                rev_00 = (lys_revision *)*plVar16;
              }
              content_00 = (int *)0x18bd6c;
              yin_print_revision(local_40,local_38,local_50,rev_00);
            }
            else {
              rev = *(lys_revision **)rev_00->date;
              plVar22 = local_40;
              while (local_40 = plVar22, rev != (lys_revision *)0x0) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar22,">\n");
                  rev = *(lys_revision **)rev_00->date;
                }
                content_00 = (int *)0x18b370;
                yin_print_revision(plVar22,local_38,local_50,rev);
                rev = *(lys_revision **)((lys_revision *)(rev_00->date + 8))->date;
                rev_00 = (lys_revision *)(rev_00->date + 8);
                uVar23 = local_58;
                plVar22 = local_40;
              }
            }
          }
        }
switchD_0018a812_caseD_13:
        local_b8 = local_b8 + 1;
      } while( true );
    }
    goto LAB_0018c2e5;
  }
  goto LAB_0018c30d;
  while( true ) {
    plVar15 = local_48[uVar23];
    pplVar24 = plVar15->ext;
    if (uVar13 == pplVar24[iVar8]->insubstmt_index) break;
LAB_0018affb:
    iVar8 = lys_ext_iter(pplVar24,plVar15->ext_size,(char)iVar8 + '\x01',LYEXT_SUBSTMT_YINELEM);
    plVar22 = local_40;
    if (iVar8 == -1) goto LAB_0018b119;
  }
  if (iVar10 == 0) {
    ly_print(local_40,">\n");
    plVar15 = local_48[uVar23];
    pplVar24 = plVar15->ext;
    iVar10 = 1;
  }
  pcVar25 = "false";
  if (*(char *)(local_68[1] + uVar13) == '\x01') {
    pcVar25 = "true";
  }
  pplVar24 = pplVar24 + iVar8;
  uVar30 = (uint)plVar15->ext_size - iVar8;
  plVar22 = local_40;
LAB_0018b110:
  yin_print_substmt(plVar22,local_5c,LYEXT_SUBSTMT_YINELEM,(uint8_t)uVar13,pcVar25,local_50,pplVar24
                    ,uVar30);
LAB_0018b119:
  content_00 = (int *)0x18b130;
  yin_print_close(plVar22,local_38,(char *)0x0,"argument",iVar10);
  pcVar25 = *(char **)(*local_68 + 8 + uVar13 * 8);
  uVar13 = uVar13 + 1;
  uVar23 = local_58;
  if (pcVar25 == (char *)0x0) goto switchD_0018a812_caseD_13;
  goto LAB_0018aef8;
switchD_0018a812_caseD_0:
  plVar15 = local_48[uVar23];
  uVar27 = (ulong)local_60;
  pcVar25 = local_a0;
  substmt = local_6c;
LAB_0018c2e5:
  yin_print_close(local_40,(int)local_98,pcVar25,plVar15->def->name,local_34[0]);
  uVar13 = local_90;
  module = local_50;
LAB_0018c30d:
  uVar23 = uVar23 + 1;
  if (uVar23 == uVar13) {
    return;
  }
  goto LAB_0018a520;
}

Assistant:

static void
yin_print_extension_instances(struct lyout *out, int level, const struct lys_module *module,
                              LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                              struct lys_ext_instance **ext, unsigned int count)
{
    unsigned int u, x;
    struct lys_module *mod;
    const char *prefix = NULL;
    struct lyext_substmt *info;
    int content, content2, i, j, c;
    uint16_t *flags;
    const char *str;
    void **pp, *p;
    struct lys_node *siter;

#define YIN_PRINT_EXTCOMPLEX_SNODE(STMT)                                                      \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    LY_TREE_FOR((struct lys_node*)(*pp), siter) {                                             \
        if (lys_snode2stmt(siter->nodetype) == STMT) {                                        \
            yin_print_close_parent(out, &content);                                            \
            yin_print_snode(out, level, siter, LYS_ANY);                                      \
        }                                                                                     \
    }
#define YIN_PRINT_EXTCOMPLEX_STRUCT(STMT, TYPE, FUNC)                                         \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    if (info[i].cardinality >= LY_STMT_CARD_SOME) { /* process array */                       \
        for (pp = *pp; *pp; pp++) {                                                           \
            yin_print_close_parent(out, &content);                                            \
            FUNC(out, level, (TYPE *)(*pp));                                                  \
        }                                                                                     \
    }